

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O3

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* pstore::path::win32::split_drive
            (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,string *path)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this;
  long lVar3;
  long lVar4;
  char cVar5;
  size_type sVar6;
  string normp;
  char *local_98;
  ulong local_90;
  char local_88;
  undefined7 uStack_87;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_78;
  _Alloc_hider local_70;
  size_type local_68;
  size_type local_60;
  undefined8 uStack_58;
  _Alloc_hider local_50;
  size_type local_48;
  size_type local_40;
  undefined8 uStack_38;
  
  if (path->_M_string_length < 2) {
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[1],_true>(__return_storage_ptr__,(char (*) [1])0x13c267,path);
    return __return_storage_ptr__;
  }
  local_98 = &local_88;
  local_90 = 0;
  local_88 = '\0';
  std::__cxx11::string::reserve((ulong)&local_98);
  sVar2 = path->_M_string_length;
  cVar5 = (char)&local_98;
  local_78 = __return_storage_ptr__;
  if (sVar2 != 0) {
    sVar6 = 0;
    do {
      std::__cxx11::string::push_back(cVar5);
      sVar6 = sVar6 + 1;
    } while (sVar2 != sVar6);
  }
  this = local_78;
  if (local_90 < 3) {
    if (local_90 == 2) goto LAB_00133e1e;
LAB_00133e74:
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[1],_true>(local_78,(char (*) [1])0x13c267,path);
  }
  else {
    if ((((*local_98 == '/') && (local_90 != 3)) && (local_98[1] == '/')) && (local_98[2] != '/')) {
      lVar3 = std::__cxx11::string::find(cVar5,0x2f);
      if (lVar3 == -1) {
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[1],_true>(this,(char (*) [1])0x13c267,path);
        goto LAB_00133ecb;
      }
      lVar4 = std::__cxx11::string::find(cVar5,0x2f);
      if (lVar4 == lVar3 + 1) {
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[1],_true>(this,(char (*) [1])0x13c267,path);
        goto LAB_00133ecb;
      }
      std::__cxx11::string::substr((ulong)&local_70,(ulong)path);
      std::__cxx11::string::substr((ulong)&local_50,(ulong)path);
    }
    else {
LAB_00133e1e:
      if (local_98[1] != ':') goto LAB_00133e74;
      std::__cxx11::string::substr((ulong)&local_70,(ulong)path);
      std::__cxx11::string::substr((ulong)&local_50,(ulong)path);
    }
    paVar1 = &(this->first).field_2;
    (this->first)._M_dataplus._M_p = (pointer)paVar1;
    if ((size_type *)local_70._M_p == &local_60) {
      paVar1->_M_allocated_capacity = local_60;
      *(undefined8 *)((long)&(this->first).field_2 + 8) = uStack_58;
    }
    else {
      (this->first)._M_dataplus._M_p = local_70._M_p;
      (this->first).field_2._M_allocated_capacity = local_60;
    }
    (this->first)._M_string_length = local_68;
    paVar1 = &(this->second).field_2;
    (this->second)._M_dataplus._M_p = (pointer)paVar1;
    if ((size_type *)local_50._M_p == &local_40) {
      paVar1->_M_allocated_capacity = local_40;
      *(undefined8 *)((long)&(this->second).field_2 + 8) = uStack_38;
    }
    else {
      (this->second)._M_dataplus._M_p = local_50._M_p;
      (this->second).field_2._M_allocated_capacity = local_40;
    }
    (this->second)._M_string_length = local_48;
  }
LAB_00133ecb:
  if (local_98 != &local_88) {
    operator_delete(local_98,CONCAT71(uStack_87,local_88) + 1);
  }
  return this;
}

Assistant:

std::pair<std::string, std::string> split_drive (std::string const & path) {
                if (path.length () <= 1) {
                    return {"", path};
                }

                // Normalize the slash direction.
                std::string normp;
                normp.reserve (path.length ());
                std::transform (std::begin (path), std::end (path), std::back_inserter (normp),
                                [] (char const c) { return c == '\\' ? '/' : c; });

                if ((normp.length () > 2 && normp[0] == '/' && normp[1] == '/') &&
                    (normp.length () > 3 && normp[2] != '/')) {
                    // This is is a UNC path:
                    // vvvvvvvvvvvvvvvvvvvv drive letter or UNC path
                    // \\machine\mountpoint\directory\etc\...
                    //           directory ^^^^^^^^^^^^^^^
                    std::string::size_type const index = normp.find ('/', 2);
                    if (index == std::string::npos) {
                        return {"", path};
                    }

                    std::string::size_type index2 = normp.find ('/', index + 1);
                    // An UNC path can't have two slashes in a row (after the initial two)
                    if (index2 == index + 1) {
                        return {"", path};
                    }
                    if (index2 == std::string::npos) {
                        index2 = path.length ();
                    }
                    return {path.substr (0, index2), path.substr (index2, std::string::npos)};
                }
                if (normp.length () > 1 && normp[1] == ':') {
                    return {path.substr (0, 2), path.substr (2, std::string::npos)};
                }
                return {"", path};
            }